

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_1e2::usage(char *argv)

{
  char *argv_local;
  
  printf("\n");
  printf(" %s - synthesis from three parameters\n",argv);
  printf("\n");
  printf("  usage:\n");
  printf("   %s input.f0 input.sp input.ap [option]\n",argv);
  printf("  option:\n");
  printf("   -o name : filename used for output          [output.wav]\n");
  printf("\n");
  return;
}

Assistant:

void usage(char *argv) {
  printf("\n");
  printf(" %s - synthesis from three parameters\n", argv);
  printf("\n");
  printf("  usage:\n");
  printf("   %s input.f0 input.sp input.ap [option]\n", argv);
  printf("  option:\n");
  printf("   -o name : filename used for output          [output.wav]\n");
  printf("\n");
}